

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2xml.hpp
# Opt level: O3

bool __thiscall ert::JsonSaxConsumer::number_unsigned(JsonSaxConsumer *this,number_unsigned_t val)

{
  bool bVar1;
  char cVar2;
  number_unsigned_t nVar3;
  char cVar4;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_30;
  
  cVar4 = '\x01';
  if (9 < val) {
    nVar3 = val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (nVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00105f3b;
      }
      if (nVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00105f3b;
      }
      if (nVar3 < 10000) goto LAB_00105f3b;
      bVar1 = 99999 < nVar3;
      nVar3 = nVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00105f3b:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,val);
  local_30._M_delim = '\"';
  local_30._M_escape = '\\';
  local_30._M_string = &local_50;
  std::__detail::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)&this->field_0x1b0,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->has_attributes_ = true;
  return true;
}

Assistant:

bool number_unsigned(number_unsigned_t val) override
    {
        current_object_ << std::quoted(std::to_string(val));
        has_attributes_ = true;
        return true;
    }